

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectedEnergyAreaAimpoint.cpp
# Opt level: O0

bool __thiscall
DIS::DirectedEnergyAreaAimpoint::operator==
          (DirectedEnergyAreaAimpoint *this,DirectedEnergyAreaAimpoint *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  ulong local_30;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  DirectedEnergyAreaAimpoint *rhs_local;
  DirectedEnergyAreaAimpoint *this_local;
  
  idx._7_1_ = this->_recordLength == rhs->_recordLength && this->_recordType == rhs->_recordType;
  if (this->_padding != rhs->_padding) {
    idx._7_1_ = false;
  }
  for (idx_1 = 0;
      sVar2 = std::vector<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>::size
                        (&this->_beamAntennaParameterList), idx_1 < sVar2; idx_1 = idx_1 + 1) {
    this_00 = std::vector<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>::
              operator[](&this->_beamAntennaParameterList,idx_1);
    rhs_00 = std::vector<DIS::BeamAntennaPattern,_std::allocator<DIS::BeamAntennaPattern>_>::
             operator[](&rhs->_beamAntennaParameterList,idx_1);
    bVar1 = BeamAntennaPattern::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
  }
  for (local_30 = 0;
      sVar2 = std::
              vector<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
              ::size(&this->_directedEnergyTargetEnergyDepositionRecordList), local_30 < sVar2;
      local_30 = local_30 + 1) {
    this_01 = std::
              vector<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
              ::operator[](&this->_directedEnergyTargetEnergyDepositionRecordList,local_30);
    rhs_01 = std::
             vector<DIS::DirectedEnergyTargetEnergyDeposition,_std::allocator<DIS::DirectedEnergyTargetEnergyDeposition>_>
             ::operator[](&rhs->_directedEnergyTargetEnergyDepositionRecordList,local_30);
    bVar1 = DirectedEnergyTargetEnergyDeposition::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
  }
  return idx._7_1_;
}

Assistant:

bool DirectedEnergyAreaAimpoint::operator ==(const DirectedEnergyAreaAimpoint& rhs) const
 {
     bool ivarsEqual = true;

     if( ! (_recordType == rhs._recordType) ) ivarsEqual = false;
     if( ! (_recordLength == rhs._recordLength) ) ivarsEqual = false;
     if( ! (_padding == rhs._padding) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _beamAntennaParameterList.size(); idx++)
     {
        if( ! ( _beamAntennaParameterList[idx] == rhs._beamAntennaParameterList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _directedEnergyTargetEnergyDepositionRecordList.size(); idx++)
     {
        if( ! ( _directedEnergyTargetEnergyDepositionRecordList[idx] == rhs._directedEnergyTargetEnergyDepositionRecordList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }